

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

vm_obj_id_t CVmObjBigNum::create_from_stack(uchar **pc_ptr,uint argc)

{
  int iVar1;
  vm_val_t *new_val_00;
  vm_val_t *pvVar2;
  char *ext;
  void *digits_00;
  uint in_ESI;
  vm_val_t new_val;
  CVmObjBigNum *objval;
  char *strval;
  size_t digits;
  vm_val_t *val;
  vm_obj_id_t id;
  vm_val_t *in_stack_ffffffffffffffa8;
  vm_obj_id_t obj_id;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  CVmObjBigNum *in_stack_ffffffffffffffc0;
  vm_obj_id_t local_38;
  CVmObject *this;
  char *pcVar3;
  size_t in_stack_ffffffffffffffe0;
  vm_obj_id_t local_10;
  
  pcVar3 = (char *)0x0;
  this = (CVmObject *)0x0;
  if ((in_ESI != 0) && (in_ESI < 3)) {
    new_val_00 = CVmStack::get(0);
    if (new_val_00->typ != VM_INT) {
      if ((new_val_00->typ == VM_OBJ) && (iVar1 = is_bignum_obj(0), iVar1 != 0)) {
        this = vm_objp(0);
      }
      else {
        pcVar3 = vm_val_t::get_as_string(in_stack_ffffffffffffffa8);
        if (pcVar3 == (char *)0x0) {
          err_throw(0);
        }
      }
    }
    obj_id = (vm_obj_id_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    if (in_ESI < 2) {
      if (pcVar3 == (char *)0x0) {
        if (this == (CVmObject *)0x0) {
          ext = (char *)0x20;
        }
        else {
          get_ext((CVmObjBigNum *)this);
          ext = (char *)get_prec((char *)0x309360);
        }
      }
      else {
        in_stack_ffffffffffffffb8 = pcVar3 + 2;
        vmb_get_len((char *)0x30932b);
        iVar1 = precision_from_string
                          ((char *)new_val_00,in_stack_ffffffffffffffe0,(int)((ulong)pcVar3 >> 0x20)
                          );
        ext = (char *)(long)iVar1;
      }
    }
    else {
      pvVar2 = CVmStack::get(1);
      if (pvVar2->typ != VM_INT) {
        err_throw(0);
      }
      pvVar2 = CVmStack::get(1);
      ext = (char *)(long)(pvVar2->val).intval;
    }
    iVar1 = (int)(in_stack_ffffffffffffffb0 >> 0x20);
    if (pcVar3 == (char *)0x0) {
      if (this == (CVmObject *)0x0) {
        local_10 = vm_new_id(iVar1,(int)in_stack_ffffffffffffffb0,obj_id);
        CVmObject::operator_new(in_stack_ffffffffffffffb0,obj_id);
        CVmObjBigNum(in_stack_ffffffffffffffc0,(long)in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb0);
      }
      else {
        get_ext((CVmObjBigNum *)this);
        round_val(new_val_00,ext,(size_t)pcVar3,(int)((ulong)this >> 0x20));
        local_10 = local_38;
      }
    }
    else {
      local_10 = vm_new_id(iVar1,(int)in_stack_ffffffffffffffb0,obj_id);
      digits_00 = CVmObject::operator_new(in_stack_ffffffffffffffb0,obj_id);
      pcVar3 = pcVar3 + 2;
      vmb_get_len((char *)0x3093b5);
      CVmObjBigNum(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(size_t)pcVar3,
                   (size_t)digits_00);
    }
    CVmStack::discard(in_ESI);
    return local_10;
  }
  err_throw(0);
}

Assistant:

vm_obj_id_t CVmObjBigNum::create_from_stack(VMG_ const uchar **pc_ptr,
                                            uint argc)
{
    vm_obj_id_t id;
    vm_val_t *val;
    size_t digits;
    const char *strval = 0;
    const CVmObjBigNum *objval = 0;

    /* check arguments */
    if (argc < 1 || argc > 2)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* 
     *   check the first argument, which gives the source value - this can be
     *   an integer, a string, or another BigNumber value 
     */
    val = G_stk->get(0);
    if (val->typ == VM_INT)
    {
        /* we'll use the integer value */
    }
    else if (val->typ == VM_OBJ && is_bignum_obj(vmg_ val->val.obj))
    {
        /* we'll use the BigNumber value as the source */
        objval = (CVmObjBigNum *)vm_objp(vmg_ val->val.obj);
    }
    else if ((strval = val->get_as_string(vmg0_)) != 0)
    {
        /* we'll parse the string value */
    }
    else
    {
        /* it's not a source type we accept */
        err_throw(VMERR_NUM_VAL_REQD);
    }

    /* 
     *   get the precision value, if provided; if not, infer it from the
     *   source value 
     */
    if (argc > 1)
    {
        /* make sure it's an integer */
        if (G_stk->get(1)->typ != VM_INT)
            err_throw(VMERR_INT_VAL_REQD);

        /* retrieve the value */
        digits = (size_t)G_stk->get(1)->val.intval;
    }
    else if (strval != 0)
    {
        /* parse the string to infer the precision */
        digits = precision_from_string(
            strval + VMB_LEN, vmb_get_len(strval), 10);
    }
    else if (objval != 0)
    {
        /* use the same precision as the source BigNumber value */
        digits = get_prec(objval->get_ext());
    }
    else
    {
        /* use a default precision */
        digits = 32;
    }

    /* create the value */
    if (strval != 0)
    {
        /* create the value from the string */
        id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
        new (vmg_ id) CVmObjBigNum(vmg_ strval + VMB_LEN,
                                   vmb_get_len(strval), digits);
    }
    else if (objval != 0)
    {
        vm_val_t new_val;

        /* create the value based on the BigNumber value */
        round_val(vmg_ &new_val, objval->get_ext(), digits, TRUE);

        /* return the new object ID */
        id = new_val.val.obj;
    }
    else
    {
        /* create the value based on the integer value */
        id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
        new (vmg_ id) CVmObjBigNum(vmg_ (long)val->val.intval, digits);
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new object */
    return id;
}